

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

void helicsTranslatorSetOption(HelicsTranslator trans,int option,int value,HelicsError *err)

{
  TranslatorObject *pTVar1;
  uint in_EDX;
  uint in_ESI;
  TranslatorObject *transObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsTranslator in_stack_ffffffffffffffd8;
  
  pTVar1 = getTranslatorObj(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pTVar1 != (TranslatorObject *)0x0) {
    (*(pTVar1->transPtr->super_Interface)._vptr_Interface[2])
              (pTVar1->transPtr,(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void helicsTranslatorSetOption(HelicsTranslator trans, int option, int value, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}